

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::PathDescriptionSyntax::PathDescriptionSyntax
          (PathDescriptionSyntax *this,Token openParen,Token edgeIdentifier,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *inputs,Token polarityOperator,
          Token pathOperator,PathSuffixSyntax *suffix,Token closeParen)

{
  Token TVar1;
  Token TVar2;
  Token TVar3;
  bool bVar4;
  NameSyntax *pNVar5;
  PathSuffixSyntax *pPVar6;
  NameSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *local_38;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *inputs_local;
  PathDescriptionSyntax *this_local;
  Token edgeIdentifier_local;
  Token openParen_local;
  
  TVar3 = closeParen;
  TVar2 = pathOperator;
  TVar1 = polarityOperator;
  edgeIdentifier_local._0_8_ = edgeIdentifier.info;
  this_local = edgeIdentifier._0_8_;
  edgeIdentifier_local.info = openParen._0_8_;
  local_38 = inputs;
  inputs_local = (SeparatedSyntaxList<slang::syntax::NameSyntax> *)this;
  SyntaxNode::SyntaxNode(&this->super_SyntaxNode,PathDescription);
  *(Info **)&this->openParen = edgeIdentifier_local.info;
  (this->openParen).info = openParen.info;
  *(PathDescriptionSyntax **)&this->edgeIdentifier = this_local;
  (this->edgeIdentifier).info = (Info *)edgeIdentifier_local._0_8_;
  SeparatedSyntaxList<slang::syntax::NameSyntax>::SeparatedSyntaxList(&this->inputs,local_38);
  (this->polarityOperator).kind = polarityOperator.kind;
  (this->polarityOperator).field_0x2 = polarityOperator._2_1_;
  (this->polarityOperator).numFlags = (NumericTokenFlags)polarityOperator.numFlags.raw;
  (this->polarityOperator).rawLen = polarityOperator.rawLen;
  polarityOperator.info = TVar1.info;
  (this->polarityOperator).info = polarityOperator.info;
  (this->pathOperator).kind = pathOperator.kind;
  (this->pathOperator).field_0x2 = pathOperator._2_1_;
  (this->pathOperator).numFlags = (NumericTokenFlags)pathOperator.numFlags.raw;
  (this->pathOperator).rawLen = pathOperator.rawLen;
  pathOperator.info = TVar2.info;
  (this->pathOperator).info = pathOperator.info;
  __range2 = (SeparatedSyntaxList<slang::syntax::NameSyntax> *)suffix;
  not_null<slang::syntax::PathSuffixSyntax*>::not_null<slang::syntax::PathSuffixSyntax*,void>
            ((not_null<slang::syntax::PathSuffixSyntax*> *)&this->suffix,
             (PathSuffixSyntax **)&__range2);
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  closeParen.info = TVar3.info;
  (this->closeParen).info = closeParen.info;
  (this->inputs).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  join_0x00000010_0x00000000_ = SeparatedSyntaxList<slang::syntax::NameSyntax>::begin(&this->inputs)
  ;
  _child = SeparatedSyntaxList<slang::syntax::NameSyntax>::end(&this->inputs);
  while( true ) {
    bVar4 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::NameSyntax_*,_unsigned_long,_slang::syntax::NameSyntax_**,_slang::syntax::NameSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::NameSyntax_*,_unsigned_long,_slang::syntax::NameSyntax_**,_slang::syntax::NameSyntax_*&>
                          *)&__end2.index,(iterator_base<slang::syntax::NameSyntax_*> *)&child);
    if (!bVar4) break;
    pNVar5 = SeparatedSyntaxList<slang::syntax::NameSyntax>::
             iterator_base<slang::syntax::NameSyntax_*>::operator*
                       ((iterator_base<slang::syntax::NameSyntax_*> *)&__end2.index);
    (pNVar5->super_ExpressionSyntax).super_SyntaxNode.parent = &this->super_SyntaxNode;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::NameSyntax_*,_unsigned_long,_slang::syntax::NameSyntax_**,_slang::syntax::NameSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::NameSyntax_*,_unsigned_long,_slang::syntax::NameSyntax_**,_slang::syntax::NameSyntax_*&>
                  *)&__end2.index);
  }
  pPVar6 = not_null<slang::syntax::PathSuffixSyntax_*>::operator->(&this->suffix);
  (pPVar6->super_SyntaxNode).parent = &this->super_SyntaxNode;
  return;
}

Assistant:

PathDescriptionSyntax(Token openParen, Token edgeIdentifier, const SeparatedSyntaxList<NameSyntax>& inputs, Token polarityOperator, Token pathOperator, PathSuffixSyntax& suffix, Token closeParen) :
        SyntaxNode(SyntaxKind::PathDescription), openParen(openParen), edgeIdentifier(edgeIdentifier), inputs(inputs), polarityOperator(polarityOperator), pathOperator(pathOperator), suffix(&suffix), closeParen(closeParen) {
        this->inputs.parent = this;
        for (auto child : this->inputs)
            child->parent = this;
        this->suffix->parent = this;
    }